

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Block * __thiscall
wasm::I64ToI32Lowering::lowerShift
          (I64ToI32Lowering *this,BinaryOp op,Block *result,TempVar *leftLow,TempVar *leftHigh,
          TempVar *rightLow,TempVar *rightHigh)

{
  If *ifFalse;
  Binary *condition;
  Index IVar1;
  Index IVar2;
  Index IVar3;
  Index IVar4;
  pointer pBVar5;
  pointer pBVar6;
  pointer pBVar7;
  LocalGet *pLVar8;
  Const *pCVar9;
  Binary *pBVar10;
  Const *right;
  Block *e;
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *puVar11;
  bool bVar12;
  optional<wasm::Type> type;
  undefined1 local_d8 [12];
  If *local_c8;
  If *ifLargeShift;
  Block *smallShiftBlock;
  Binary *local_b0;
  Binary *widthLessShift;
  Binary *local_a0;
  Binary *shiftMask;
  Block *largeShiftBlock;
  Binary *local_88;
  Binary *isLargeShift;
  Type local_70;
  LocalSet *local_68;
  LocalSet *setShift;
  undefined1 local_58 [8];
  TempVar shift;
  TempVar *rightLow_local;
  TempVar *leftHigh_local;
  TempVar *leftLow_local;
  Block *result_local;
  BinaryOp op_local;
  I64ToI32Lowering *this_local;
  
  bVar12 = true;
  if ((op != ShlInt64) && (bVar12 = true, op != ShrUInt64)) {
    bVar12 = op == ShrSInt64;
  }
  shift.ty.id = (uintptr_t)rightLow;
  if (!bVar12) {
    __assert_fail("op == ShlInt64 || op == ShrUInt64 || op == ShrSInt64",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                  ,0x4bc,
                  "Block *wasm::I64ToI32Lowering::lowerShift(BinaryOp, Block *, TempVar &&, TempVar &&, TempVar &&, TempVar &&)"
                 );
  }
  wasm::Type::Type((Type *)&setShift,i32);
  getTemp((TempVar *)local_58,this,(Type)setShift);
  puVar11 = &this->builder;
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar11);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar11);
  pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar11);
  IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)shift.ty.id);
  wasm::Type::Type(&local_70,i32);
  pLVar8 = Builder::makeLocalGet(pBVar7,IVar2,local_70);
  pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pCVar9 = Builder::makeConst<int>(pBVar7,0x1f);
  pBVar10 = Builder::makeBinary(pBVar6,AndInt32,(Expression *)pLVar8,(Expression *)pCVar9);
  local_68 = Builder::makeLocalSet(pBVar5,IVar1,(Expression *)pBVar10);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pCVar9 = Builder::makeConst<int>(pBVar6,0x20);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)shift.ty.id);
  wasm::Type::Type((Type *)&largeShiftBlock,i32);
  pLVar8 = Builder::makeLocalGet(pBVar7,IVar1,(Type)largeShiftBlock);
  pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  right = Builder::makeConst<int>(pBVar7,0x3f);
  pBVar10 = Builder::makeBinary(pBVar6,AndInt32,(Expression *)pLVar8,(Expression *)right);
  local_88 = Builder::makeBinary(pBVar5,LeUInt32,(Expression *)pCVar9,(Expression *)pBVar10);
  if (op == ShlInt64) {
    IVar1 = TempVar::operator_cast_to_unsigned_int(rightHigh);
    IVar2 = TempVar::operator_cast_to_unsigned_int(leftLow);
    IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
    shiftMask = (Binary *)makeLargeShl(this,IVar1,IVar2,IVar3);
  }
  else if (op == ShrSInt64) {
    IVar1 = TempVar::operator_cast_to_unsigned_int(rightHigh);
    IVar2 = TempVar::operator_cast_to_unsigned_int(leftHigh);
    IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
    shiftMask = (Binary *)makeLargeShrS(this,IVar1,IVar2,IVar3);
  }
  else {
    if (op != ShrUInt64) {
      abort();
    }
    IVar1 = TempVar::operator_cast_to_unsigned_int(rightHigh);
    IVar2 = TempVar::operator_cast_to_unsigned_int(leftHigh);
    IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
    shiftMask = (Binary *)makeLargeShrU(this,IVar1,IVar2,IVar3);
  }
  puVar11 = &this->builder;
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar11);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar11);
  pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar11);
  pCVar9 = Builder::makeConst<int>(pBVar7,1);
  pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
  wasm::Type::Type((Type *)&widthLessShift,i32);
  pLVar8 = Builder::makeLocalGet(pBVar7,IVar1,(Type)widthLessShift);
  pBVar10 = Builder::makeBinary(pBVar6,ShlInt32,(Expression *)pCVar9,(Expression *)pLVar8);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pCVar9 = Builder::makeConst<int>(pBVar6,1);
  local_a0 = Builder::makeBinary(pBVar5,SubInt32,(Expression *)pBVar10,(Expression *)pCVar9);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pCVar9 = Builder::makeConst<int>(pBVar6,0x20);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
  wasm::Type::Type((Type *)&smallShiftBlock,i32);
  pLVar8 = Builder::makeLocalGet(pBVar6,IVar1,(Type)smallShiftBlock);
  local_b0 = Builder::makeBinary(pBVar5,SubInt32,(Expression *)pCVar9,(Expression *)pLVar8);
  if (op == ShlInt64) {
    IVar1 = TempVar::operator_cast_to_unsigned_int(rightHigh);
    IVar2 = TempVar::operator_cast_to_unsigned_int(leftLow);
    IVar3 = TempVar::operator_cast_to_unsigned_int(leftHigh);
    IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
    ifLargeShift = (If *)makeSmallShl(this,IVar1,IVar2,IVar3,IVar4,local_a0,local_b0);
  }
  else if (op == ShrSInt64) {
    IVar1 = TempVar::operator_cast_to_unsigned_int(rightHigh);
    IVar2 = TempVar::operator_cast_to_unsigned_int(leftLow);
    IVar3 = TempVar::operator_cast_to_unsigned_int(leftHigh);
    IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
    ifLargeShift = (If *)makeSmallShrS(this,IVar1,IVar2,IVar3,IVar4,local_a0,local_b0);
  }
  else {
    if (op != ShrUInt64) {
      abort();
    }
    IVar1 = TempVar::operator_cast_to_unsigned_int(rightHigh);
    IVar2 = TempVar::operator_cast_to_unsigned_int(leftLow);
    IVar3 = TempVar::operator_cast_to_unsigned_int(leftHigh);
    IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
    ifLargeShift = (If *)makeSmallShrU(this,IVar1,IVar2,IVar3,IVar4,local_a0,local_b0);
  }
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  condition = local_88;
  pBVar10 = shiftMask;
  ifFalse = ifLargeShift;
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_d8);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_d8._0_8_;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_d8[8];
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_d8._9_3_;
  local_c8 = Builder::makeIf(pBVar5,(Expression *)condition,(Expression *)pBVar10,
                             (Expression *)ifFalse,type);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  e = Builder::blockify<wasm::If*>(pBVar5,(Expression *)result,(Expression *)local_68,local_c8);
  setOutParam(this,(Expression *)e,rightHigh);
  TempVar::~TempVar((TempVar *)local_58);
  return e;
}

Assistant:

Block* lowerShift(BinaryOp op,
                    Block* result,
                    TempVar&& leftLow,
                    TempVar&& leftHigh,
                    TempVar&& rightLow,
                    TempVar&& rightHigh) {
    assert(op == ShlInt64 || op == ShrUInt64 || op == ShrSInt64);
    // shift left lowered as:
    // if 32 <= rightLow % 64:
    //     high = leftLow << k; low = 0
    // else:
    //     high = (((1 << k) - 1) & (leftLow >> (32 - k))) | (leftHigh << k);
    //     low = leftLow << k
    // where k = shift % 32. shift right is similar.
    TempVar shift = getTemp();
    LocalSet* setShift = builder->makeLocalSet(
      shift,
      builder->makeBinary(AndInt32,
                          builder->makeLocalGet(rightLow, Type::i32),
                          builder->makeConst(int32_t(32 - 1))));
    Binary* isLargeShift = builder->makeBinary(
      LeUInt32,
      builder->makeConst(int32_t(32)),
      builder->makeBinary(AndInt32,
                          builder->makeLocalGet(rightLow, Type::i32),
                          builder->makeConst(int32_t(64 - 1))));
    Block* largeShiftBlock;
    switch (op) {
      case ShlInt64:
        largeShiftBlock = makeLargeShl(rightHigh, leftLow, shift);
        break;
      case ShrSInt64:
        largeShiftBlock = makeLargeShrS(rightHigh, leftHigh, shift);
        break;
      case ShrUInt64:
        largeShiftBlock = makeLargeShrU(rightHigh, leftHigh, shift);
        break;
      default:
        abort();
    }
    Binary* shiftMask = builder->makeBinary(
      SubInt32,
      builder->makeBinary(ShlInt32,
                          builder->makeConst(int32_t(1)),
                          builder->makeLocalGet(shift, Type::i32)),
      builder->makeConst(int32_t(1)));
    Binary* widthLessShift =
      builder->makeBinary(SubInt32,
                          builder->makeConst(int32_t(32)),
                          builder->makeLocalGet(shift, Type::i32));
    Block* smallShiftBlock;
    switch (op) {
      case ShlInt64: {
        smallShiftBlock = makeSmallShl(
          rightHigh, leftLow, leftHigh, shift, shiftMask, widthLessShift);
        break;
      }
      case ShrSInt64: {
        smallShiftBlock = makeSmallShrS(
          rightHigh, leftLow, leftHigh, shift, shiftMask, widthLessShift);
        break;
      }
      case ShrUInt64: {
        smallShiftBlock = makeSmallShrU(
          rightHigh, leftLow, leftHigh, shift, shiftMask, widthLessShift);
        break;
      }
      default:
        abort();
    }
    If* ifLargeShift =
      builder->makeIf(isLargeShift, largeShiftBlock, smallShiftBlock);
    result = builder->blockify(result, setShift, ifLargeShift);
    setOutParam(result, std::move(rightHigh));
    return result;
  }